

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

reference __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
::iterator::operator*(iterator *this)

{
  uint uVar1;
  int iVar2;
  code *pcVar3;
  reference ppVar4;
  code *in_RCX;
  code *extraout_RDX;
  SchedulingMode in_ESI;
  bool bVar5;
  
  pcVar3 = (code *)this->ctrl_;
  if (pcVar3 == (code *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
    ::iterator::operator*((iterator *)this);
LAB_00210f8f:
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    in_RCX = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
    if (pcVar3 == absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>)
    goto LAB_00210f8f;
    if (-1 < (char)*pcVar3) {
      return (reference)(this->field_1).slot_;
    }
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
  ::iterator::operator*((iterator *)this);
  iVar2 = *(int *)&this->ctrl_;
  if (iVar2 < 0x5a308d2) {
    if ((iVar2 != 0) && (iVar2 != 0xdd)) {
LAB_00211028:
      absl::lts_20240722::raw_log_internal::RawLog
                (kFatal,"call_once.h",0xa2,"Unexpected value for control word: 0x%lx");
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/base/call_once.h"
                    ,0xa2,
                    "void absl::base_internal::CallOnceImpl(absl::Nonnull<std::atomic<uint32_t> *>, base_internal::SchedulingMode, Callable &&, Args &&...) [Callable = void (&)(const google::protobuf::FileDescriptorTables *), Args = <const google::protobuf::FileDescriptorTables *>]"
                   );
    }
  }
  else if ((iVar2 != 0x5a308d2) && (iVar2 != 0x65c2937b)) goto LAB_00211028;
  LOCK();
  bVar5 = *(int *)&this->ctrl_ == 0;
  if (bVar5) {
    *(undefined4 *)&this->ctrl_ = 0x65c2937b;
  }
  UNLOCK();
  if ((bVar5) ||
     (ppVar4 = (reference)
               absl::lts_20240722::base_internal::SpinLockWait
                         ((atomic *)this,3,
                          base_internal::
                          CallOnceImpl<void_(&)(const_google::protobuf::FileDescriptorTables_*),_const_google::protobuf::FileDescriptorTables_*>
                          ::trans,in_ESI), (int)ppVar4 == 0)) {
    (*extraout_RDX)(*(undefined8 *)in_RCX);
    LOCK();
    uVar1 = *(uint *)&this->ctrl_;
    *(undefined4 *)&this->ctrl_ = 0xdd;
    ppVar4 = (reference)(ulong)uVar1;
    UNLOCK();
    if (uVar1 == 0x5a308d2) {
      ppVar4 = (reference)AbslInternalSpinLockWake_lts_20240722(this,1);
      return ppVar4;
    }
  }
  return ppVar4;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }